

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCase::
verify<tcu::TextureCubeView,tcu::Vector<float,3>>
          (TextureGatherCase *this,ConstPixelBufferAccess *rendered,TextureCubeView *texture,
          Vector<float,_3> (*texCoords) [4],GatherArgs *gatherArgs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  GatherType gatherType;
  ChannelOrder CVar5;
  uint uVar6;
  PixelOffsets *pPVar7;
  bool bVar8;
  byte bVar9;
  int i;
  long lVar10;
  ulong uVar11;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  ulong uVar12;
  ConstPixelBufferAccess *pCVar13;
  Surface *pSVar14;
  WrapMode WVar15;
  int iVar16;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  int iVar17;
  uint uVar18;
  void *data;
  undefined8 data_00;
  int px;
  ChannelOrder CVar19;
  int componentNdx;
  int px_1;
  ChannelOrder CVar20;
  TextureFormat TVar21;
  int iVar22;
  undefined1 auVar24 [12];
  undefined1 auVar23 [16];
  Vector<float,_3> VVar25;
  Vec2 viewportCoord;
  Vector<bool,_4> res_12;
  Vector<bool,_4> res_11;
  Vector<bool,_4> res_4;
  Vector<float,_3> texCoord;
  Surface ideal;
  Surface errorMask_1;
  Surface errorMask;
  Vec4 resultPix;
  Vec4 idealPix;
  TextureLevel ideal_1;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
  pixelOffsets;
  PixelBufferAccess idealAccess;
  Sampler sampler;
  Vector<int,_4> res;
  IVec4 colorBits;
  undefined1 local_438 [8];
  TextureFormat TStack_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  uint local_410;
  byte local_40c [4];
  TextureFormat local_408;
  float local_400;
  byte local_3fc [4];
  string local_3f8;
  float local_3cc;
  undefined1 local_3c8 [8];
  TextureFormat local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  ConstPixelBufferAccess *local_3a0;
  undefined1 local_398 [8];
  void *local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  Surface local_378;
  undefined1 local_360 [8];
  void *local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  Sampler *local_340;
  undefined1 local_338 [144];
  undefined1 local_2a8 [8];
  ConstPixelBufferAccess *local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  TextureLevel local_280;
  Vector<float,_3> (*local_258) [4];
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
  local_250;
  float local_23c;
  undefined1 local_238 [24];
  TextureFormat local_220;
  TextureFormat TStack_218;
  BVec4 local_210;
  Sampler local_208;
  undefined1 local_1c8 [8];
  TextureFormat TStack_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [4];
  ios_base local_150 [264];
  IVec4 local_48;
  
  local_258 = texCoords;
  local_408 = *(TextureFormat *)(*(long *)(this + 8) + 0x10);
  local_3a0 = rendered;
  local_340 = (Sampler *)texture;
  if (((byte)this[0xb4] & 1) != 0) {
    uVar12 = 0;
    uVar11 = (ulong)(uint)gatherArgs->componentNdx;
    if (gatherArgs->componentNdx < 1) {
      uVar11 = uVar12;
    }
    local_338._0_4_ = R;
    local_338._4_4_ = SNORM_INT8;
    local_338._8_8_ = (ConstPixelBufferAccess *)0x3f80000000000000;
    WVar15 = *(WrapMode *)(local_338 + uVar11 * 4);
    do {
      (&local_208.wrapS)[uVar12] = WVar15;
      uVar12 = uVar12 + 1;
    } while (uVar12 != 4);
    bVar9 = anon_unknown_0::verifySingleColored((TestLog *)local_408,rendered,(Vec4 *)&local_208);
    if (!(bool)bVar9) {
      local_1c8 = (undefined1  [8])local_408;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_1c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&TStack_1c0,"Note: expected color ",0x15);
      tcu::operator<<((ostream *)&TStack_1c0,(Vector<float,_4> *)&local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&TStack_1c0," for all pixels; ",0x11);
      std::ostream::_M_insert<double>((double)*(float *)(local_338 + uVar11 * 4));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&TStack_1c0," is component at index ",0x17);
      std::ostream::operator<<(&TStack_1c0,(int)uVar11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&TStack_1c0," in the color ",0xe);
      tcu::operator<<((ostream *)&TStack_1c0,(Vector<float,_4> *)local_338);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&TStack_1c0,", which is used for incomplete textures",0x27);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_1c0);
      std::ios_base::~ios_base(local_150);
    }
    goto LAB_00609642;
  }
  gatherType = *(GatherType *)(this + 0x78);
  anon_unknown_0::TextureGatherCase::getOffsetRange((TextureGatherCase *)local_1c8);
  anon_unknown_0::makePixelOffsetsFunctor(&local_250,gatherType,gatherArgs,(IVec2 *)local_1c8);
  pPVar7 = local_250.
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
           .m_data.ptr;
  TVar21 = local_408;
  local_338._0_4_ = RGBA;
  local_338._4_4_ = UNORM_SHORT_565;
  local_338._8_8_ = (ConstPixelBufferAccess *)0x800000008;
  local_1c8._0_4_ = R;
  local_1c8._4_4_ = SNORM_INT8;
  TStack_1c0.order = R;
  TStack_1c0.type = SNORM_INT8;
  lVar10 = 0;
  do {
    *(int *)(local_1c8 + lVar10 * 4) = *(int *)(local_338 + lVar10 * 4) + -1;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  local_208.wrapS = CLAMP_TO_EDGE;
  local_208.wrapT = CLAMP_TO_EDGE;
  local_208.wrapR = CLAMP_TO_EDGE;
  local_208.minFilter = NEAREST;
  local_48.m_data[0] = 0;
  local_48.m_data[1] = 0;
  local_48.m_data[2] = 0;
  local_48.m_data[3] = 0;
  lVar10 = 0;
  do {
    WVar15 = (&local_208.wrapS)[lVar10];
    if ((int)(&local_208.wrapS)[lVar10] < (int)*(WrapMode *)(local_1c8 + lVar10 * 4)) {
      WVar15 = *(WrapMode *)(local_1c8 + lVar10 * 4);
    }
    local_48.m_data[lVar10] = WVar15;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  uVar18 = *(uint *)(this + 0xb8);
  uVar11 = (ulong)uVar18;
  iVar17 = -1;
  CVar20 = ~R;
  iVar22 = -1;
  if (uVar11 < 3) {
    CVar20 = *(ChannelOrder *)(&DAT_009c05a8 + uVar11 * 4);
    iVar22 = uVar18 * 10;
  }
  iVar16 = -1;
  if (uVar18 < 3) {
    iVar17 = *(int *)(&DAT_009c05b4 + uVar11 * 4);
    iVar16 = *(int *)(&DAT_009c05c0 + uVar11 * 4);
  }
  local_208.wrapR = WRAPMODE_LAST;
  local_208.minFilter = FILTERMODE_LAST;
  local_208.magFilter = FILTERMODE_LAST;
  local_208.lodThreshold = 0.0;
  local_208.normalizedCoords = true;
  local_208.depthStencilMode = MODE_DEPTH;
  local_208.borderColor.v.uData[0]._0_1_ = 0;
  local_208.borderColor.v._1_7_ = 0;
  local_208.borderColor.v.uData[2]._0_1_ = 0;
  local_208._45_8_ = 0;
  local_208._0_8_ = *(undefined8 *)(this + 0x8c);
  local_208.compareChannel = 0;
  local_208.compare = *(uint *)(this + 0x88);
  if ((*(int *)(this + 0x80) == 0x14) || (*(int *)(this + 0x80) == 0x12)) {
    lVar10 = 0;
    do {
      local_280.m_size.m_data[lVar10 + -2] = 0x16;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar10 = 3;
    do {
      local_280.m_size.m_data[lVar10 + -2] = 0x10;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 6);
    local_280.m_data.m_ptr = (void *)0x1000000010;
    local_280.m_data.m_cap._0_4_ = 7;
    local_378._0_8_ = &PTR_operator___00b57968;
    local_378.m_pixels.m_ptr = (void *)0x4000000040;
    CVar5 = (local_3a0->m_size).m_data[0];
    local_280.m_format.order = CVar20;
    local_280.m_format.type = CVar20;
    local_280.m_size.m_data[0] = iVar22;
    local_280.m_size.m_data[1] = iVar17;
    local_280.m_size.m_data[2] = iVar17;
    local_280._20_4_ = iVar16;
    tcu::Surface::Surface((Surface *)local_398,CVar5,CVar5);
    TVar21 = local_408;
    local_1c8._0_4_ = RGBA;
    local_1c8._4_4_ = UNORM_INT8;
    data = (void *)CONCAT26(local_388._M_allocated_capacity._6_2_,
                            local_388._M_allocated_capacity._0_6_);
    if ((void *)CONCAT26(local_388._M_allocated_capacity._6_2_,local_388._M_allocated_capacity._0_6_
                        ) != (void *)0x0) {
      data = local_390;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_238,(TextureFormat *)local_1c8,local_398._0_4_,
               local_398._4_4_,1,data);
    tcu::Surface::Surface((Surface *)local_360,CVar5,CVar5);
    local_338._0_4_ = RGBA;
    local_338._4_4_ = UNORM_INT8;
    data_00 = local_350._M_allocated_capacity;
    if ((void *)local_350._M_allocated_capacity != (void *)0x0) {
      data_00 = local_358;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1c8,(TextureFormat *)local_338,local_360._0_4_,
               local_360._4_4_,1,(void *)data_00);
    local_2a8._0_4_ = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)local_338);
    tcu::clear((PixelBufferAccess *)local_1c8,(Vec4 *)local_338);
    if ((int)CVar5 < 1) {
      uVar18 = 1;
    }
    else {
      local_23c = (float)(int)CVar5;
      local_410 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      CVar20 = R;
      do {
        local_3cc = (float)(int)CVar20;
        CVar19 = R;
        do {
          local_1b8._M_allocated_capacity = 0;
          local_1b8._8_8_ = 0;
          local_1c8._0_4_ = R;
          local_1c8._4_4_ = SNORM_INT8;
          TStack_1c0.order = R;
          TStack_1c0.type = SNORM_INT8;
          local_338._4_4_ = CVar20;
          local_338._0_4_ = CVar19;
          (**pPVar7->_vptr_PixelOffsets)(pPVar7,(ConstPixelBufferAccess *)local_338,local_1c8);
          local_2a8._4_4_ = local_3cc;
          local_2a8._0_4_ = (float)(int)CVar19;
          local_338._0_4_ = R;
          local_338._4_4_ = SNORM_INT8;
          lVar10 = 0;
          do {
            *(float *)(local_338 + lVar10 * 4) = *(float *)(local_2a8 + lVar10 * 4) + 0.5;
            lVar10 = lVar10 + 1;
          } while (lVar10 == 1);
          local_3c8._4_4_ = local_23c;
          local_3c8._0_4_ = local_23c;
          local_438._0_4_ = R;
          local_438._4_4_ = SNORM_INT8;
          lVar10 = 0;
          do {
            *(float *)(local_438 + lVar10 * 4) =
                 *(float *)(local_338 + lVar10 * 4) / *(float *)(local_3c8 + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (lVar10 == 1);
          auVar24 = (undefined1  [12])0x0;
          VVar25 = triQuadInterpolate<tcu::Vector<float,3>>
                             ((_anonymous_namespace_ *)local_3c8,local_258,(float)local_438._0_4_,
                              (float)local_438._4_4_);
          auVar23._0_4_ = VVar25.m_data[2];
          auVar23._4_12_ = auVar24;
          local_338._4_4_ = CVar20;
          local_338._0_4_ = CVar19;
          local_400 = (float)(**(code **)local_378._0_8_)
                                       (VVar25.m_data[0],auVar23._0_8_,&local_378,
                                        (ConstPixelBufferAccess *)local_338);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_338,(int)local_3a0,CVar19,CVar20);
          tcu::TextureCubeView::gatherCompare
                    ((TextureCubeView *)local_2a8,local_340,local_400,(float)local_3c8._0_4_,
                     (float)local_3c8._4_4_,(float)local_3c0.order);
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_238,(Vec4 *)local_2a8,CVar19,CVar20,0);
          local_3f8._M_dataplus._M_p = local_3f8._M_dataplus._M_p & 0xffffffff00000000;
          lVar10 = 0;
          do {
            *(bool *)((long)&local_3f8._M_dataplus._M_p + lVar10) =
                 *(float *)(local_338 + lVar10 * 4) == *(float *)(local_2a8 + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          if ((char)local_3f8._M_dataplus._M_p == '\0') {
LAB_00607e3e:
            bVar8 = tcu::isGatherCompareResultValid
                              ((TextureCubeView *)local_340,&local_208,
                               (TexComparePrecision *)&local_280,(Vec3 *)local_3c8,local_400,
                               (Vec4 *)local_338);
            if (!bVar8) {
              *(undefined4 *)((long)local_358 + (long)(int)(local_360._0_4_ * CVar20 + CVar19) * 4)
                   = 0xff0000ff;
              local_410 = 0;
            }
          }
          else {
            uVar11 = 0xffffffffffffffff;
            do {
              if (uVar11 == 2) {
                uVar12 = 3;
                break;
              }
              uVar12 = uVar11 + 1;
              lVar10 = uVar11 + 2;
              uVar11 = uVar12;
            } while (*(char *)((long)&local_3f8._M_dataplus._M_p + lVar10) != '\0');
            if (uVar12 < 3) goto LAB_00607e3e;
          }
          CVar19 = CVar19 + A;
        } while (CVar19 != CVar5);
        CVar20 = CVar20 + A;
        TVar21 = local_408;
        uVar18 = local_410;
      } while (CVar20 != CVar5);
    }
    bVar9 = (byte)uVar18;
    local_298._M_allocated_capacity = 0x6552796669726556;
    local_298._8_4_ = 0x746c7573;
    local_2a0 = (ConstPixelBufferAccess *)0xc;
    local_298._M_local_buf[0xc] = '\0';
    local_3c8 = (undefined1  [8])&local_3b8;
    local_1c8._0_4_ = S;
    local_1c8._4_4_ = SNORM_INT8;
    local_2a8 = (undefined1  [8])&local_298;
    local_3c8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_3c8,(ulong)local_1c8);
    local_3b8._M_allocated_capacity = (size_type)local_1c8;
    *(undefined8 *)local_3c8 = 0x6163696669726556;
    builtin_strncpy((char *)((long)local_3c8 + 8),"tion res",8);
    builtin_strncpy((char *)((long)local_3c8 + 0xf),"sult",4);
    local_3c0.order = local_1c8._0_4_;
    local_3c0.type = local_1c8._4_4_;
    *(char *)((long)local_3c8 + (long)local_1c8) = '\0';
    tcu::LogImageSet::LogImageSet((LogImageSet *)local_338,(string *)local_2a8,(string *)local_3c8);
    tcu::TestLog::startImageSet((TestLog *)TVar21,(char *)local_338._0_8_,(char *)local_338._32_8_);
    local_428._M_allocated_capacity = 0x64657265646e6552;
    TStack_430.order = RGBA;
    TStack_430.type = SNORM_INT8;
    local_428._8_2_ = (ushort)(byte)local_428._M_local_buf[9] << 8;
    paVar1 = &local_3f8.field_2;
    local_3f8.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
    local_3f8.field_2._M_allocated_capacity._6_2_ = 0x6465;
    local_3f8.field_2._M_local_buf[8] = ' ';
    local_3f8.field_2._M_local_buf[9] = 'i';
    local_3f8.field_2._10_4_ = 0x6567616d;
    local_3f8._M_string_length._0_4_ = sRGB;
    local_3f8._M_string_length._4_4_ = SNORM_INT8;
    local_3f8.field_2._M_local_buf[0xe] = '\0';
    pCVar13 = local_3a0;
    local_438 = (undefined1  [8])&local_428;
    local_3f8._M_dataplus._M_p = (pointer)paVar1;
    tcu::LogImage::LogImage
              ((LogImage *)local_1c8,(string *)local_438,&local_3f8,local_3a0,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1c8,TVar21.order,__buf,(size_t)pCVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_allocated_capacity != local_198) {
      operator_delete((void *)local_1a8._M_allocated_capacity,
                      (ulong)(local_198[0]._M_allocated_capacity + 1));
    }
    if (local_1c8 != (undefined1  [8])&local_1b8) {
      operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_3f8._M_dataplus._M_p,
                      CONCAT26(local_3f8.field_2._M_allocated_capacity._6_2_,
                               local_3f8.field_2._M_allocated_capacity._0_6_) + 1);
    }
    if (local_438 != (undefined1  [8])&local_428) {
      operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
    }
    if ((ConstPixelBufferAccess *)local_338._32_8_ != (ConstPixelBufferAccess *)(local_338 + 0x30))
    {
      operator_delete((void *)local_338._32_8_,(ulong)(local_338._48_8_ + 1));
    }
    if (local_338._0_8_ != (long)local_338 + 0x10) {
      operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
    }
    if (local_3c8 != (undefined1  [8])&local_3b8) {
      operator_delete((void *)local_3c8,(ulong)(local_3b8._M_allocated_capacity + 1));
    }
    if (local_2a8 != (undefined1  [8])&local_298) {
      operator_delete((void *)local_2a8,(ulong)(local_298._M_allocated_capacity + 1));
    }
    if ((uVar18 & 1) == 0) {
      local_298._M_allocated_capacity = 0x636e657265666552;
      local_298._8_2_ = 0x65;
      local_2a0 = (ConstPixelBufferAccess *)0x9;
      local_3c8 = (undefined1  [8])&local_3b8;
      local_338._0_4_ = CHANNELORDER_LAST;
      local_338._4_4_ = SNORM_INT8;
      local_2a8 = (undefined1  [8])&local_298;
      local_3c8 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_3c8,(ulong)local_338);
      local_3b8._M_allocated_capacity = local_338._0_8_;
      *(undefined8 *)local_3c8 = 0x6572206c61656449;
      builtin_strncpy((char *)((long)local_3c8 + 8),"ference ",8);
      builtin_strncpy((char *)((long)local_3c8 + 0xd),"ce image",8);
      local_3c0.order = local_338._0_4_;
      local_3c0.type = local_338._4_4_;
      *(char *)((long)local_3c8 + local_338._0_8_) = '\0';
      pSVar14 = (Surface *)local_398;
      tcu::LogImage::LogImage
                ((LogImage *)local_1c8,(string *)local_2a8,(string *)local_3c8,pSVar14,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_1c8,local_408.order,__buf_00,(size_t)pSVar14);
      local_428._M_allocated_capacity = 0x73614d726f727245;
      local_428._8_2_ = 0x6b;
      TStack_430.order = ARGB;
      TStack_430.type = SNORM_INT8;
      local_3f8.field_2._M_allocated_capacity._0_6_ = 0x20726f727245;
      local_3f8.field_2._M_allocated_capacity._6_2_ = 0x616d;
      local_3f8.field_2._M_local_buf[8] = 's';
      local_3f8.field_2._M_local_buf[9] = 'k';
      local_3f8._M_string_length._0_4_ = BGR;
      local_3f8._M_string_length._4_4_ = SNORM_INT8;
      local_3f8.field_2._10_4_ = local_3f8.field_2._10_4_ & 0xffffff00;
      pSVar14 = (Surface *)local_360;
      local_438 = (undefined1  [8])&local_428;
      local_3f8._M_dataplus._M_p = (pointer)paVar1;
      tcu::LogImage::LogImage
                ((LogImage *)local_338,(string *)local_438,&local_3f8,pSVar14,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_338,local_408.order,__buf_01,(size_t)pSVar14);
      if ((ConstPixelBufferAccess *)local_338._32_8_ != (ConstPixelBufferAccess *)(local_338 + 0x30)
         ) {
        operator_delete((void *)local_338._32_8_,(ulong)(local_338._48_8_ + 1));
      }
      if (local_338._0_8_ != (long)local_338 + 0x10) {
        operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_3f8._M_dataplus._M_p,
                        CONCAT26(local_3f8.field_2._M_allocated_capacity._6_2_,
                                 local_3f8.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if (local_438 != (undefined1  [8])&local_428) {
        operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity != local_198) {
        operator_delete((void *)local_1a8._M_allocated_capacity,
                        (ulong)(local_198[0]._M_allocated_capacity + 1));
      }
      if (local_1c8 != (undefined1  [8])&local_1b8) {
        operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
      }
      if (local_3c8 != (undefined1  [8])&local_3b8) {
        operator_delete((void *)local_3c8,(ulong)(local_3b8._M_allocated_capacity + 1));
      }
      if (local_2a8 != (undefined1  [8])&local_298) {
        operator_delete((void *)local_2a8,(ulong)(local_298._M_allocated_capacity + 1));
      }
    }
    tcu::TestLog::endImageSet((TestLog *)local_408);
    tcu::Surface::~Surface((Surface *)local_360);
    tcu::Surface::~Surface((Surface *)local_398);
  }
  else {
    componentNdx = 0;
    if (0 < gatherArgs->componentNdx) {
      componentNdx = gatherArgs->componentNdx;
    }
    uVar18 = *(uint *)(this + 0x84);
    uVar11 = (ulong)uVar18;
    if (uVar11 < 0x22) {
      if ((0x58UL >> (uVar11 & 0x3f) & 1) == 0) {
        if ((0x2c0000000U >> (uVar11 & 0x3f) & 1) == 0) goto LAB_00609185;
        goto LAB_00608039;
      }
      lVar10 = 0;
      do {
        *(undefined4 *)(local_238 + lVar10 * 4) = 0x16;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      lVar10 = 3;
      do {
        *(undefined4 *)(local_238 + lVar10 * 4) = 0x10;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 6);
      local_220.order = R;
      local_220.type = SNORM_INT8;
      TStack_218 = (TextureFormat)0x0;
      local_210.m_data[0] = true;
      local_210.m_data[1] = true;
      local_210.m_data[2] = true;
      local_210.m_data[3] = true;
      tcu::computeFixedPointThreshold((tcu *)local_1c8,&local_48);
      pPVar7 = local_250.
               super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
               .m_data.ptr;
      local_220.order = local_1c8._0_4_;
      local_220.type = local_1c8._4_4_;
      TStack_218 = TStack_1c0;
      local_210.m_data[0] = true;
      local_210.m_data[1] = true;
      local_210.m_data[2] = true;
      local_210.m_data[3] = true;
      CVar5 = (local_3a0->m_size).m_data[0];
      local_238._0_4_ = CVar20;
      local_238._4_4_ = CVar20;
      local_238._8_4_ = iVar22;
      local_238._12_4_ = iVar17;
      local_238._16_4_ = iVar17;
      local_238._20_4_ = iVar16;
      tcu::TextureLevel::TextureLevel(&local_280,&local_3a0->m_format,CVar5,CVar5,1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_2a8,&local_280);
      TVar21 = local_408;
      tcu::Surface::Surface(&local_378,CVar5,CVar5);
      local_338._0_4_ = RGBA;
      local_338._4_4_ = UNORM_INT8;
      if ((void *)local_378.m_pixels.m_cap != (void *)0x0) {
        local_378.m_pixels.m_cap = (size_t)local_378.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1c8,(TextureFormat *)local_338,local_378.m_width,
                 local_378.m_height,1,(void *)local_378.m_pixels.m_cap);
      local_3c8._0_4_ = -1.7146522e+38;
      tcu::RGBA::toVec((RGBA *)local_338);
      tcu::clear((PixelBufferAccess *)local_1c8,(Vec4 *)local_338);
      if ((int)CVar5 < 1) {
        uVar18 = 1;
      }
      else {
        local_3cc = (float)(int)CVar5;
        local_410 = (uint)CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
        CVar20 = R;
        do {
          local_400 = (float)(int)CVar20;
          CVar19 = R;
          do {
            local_1b8._M_allocated_capacity = 0;
            local_1b8._8_8_ = 0;
            local_1c8._0_4_ = R;
            local_1c8._4_4_ = SNORM_INT8;
            TStack_1c0.order = R;
            TStack_1c0.type = SNORM_INT8;
            local_338._4_4_ = CVar20;
            local_338._0_4_ = CVar19;
            (**pPVar7->_vptr_PixelOffsets)(pPVar7,(ConstPixelBufferAccess *)local_338,local_1c8);
            local_3c8._4_4_ = local_400;
            local_3c8._0_4_ = (float)(int)CVar19;
            local_338._0_4_ = R;
            local_338._4_4_ = SNORM_INT8;
            lVar10 = 0;
            do {
              *(float *)(local_338 + lVar10 * 4) = *(float *)(local_3c8 + lVar10 * 4) + 0.5;
              lVar10 = lVar10 + 1;
            } while (lVar10 == 1);
            local_438._4_4_ = local_3cc;
            local_438._0_4_ = local_3cc;
            local_360 = (undefined1  [8])0x0;
            lVar10 = 0;
            do {
              *(float *)(local_360 + lVar10 * 4) =
                   *(float *)(local_338 + lVar10 * 4) / *(float *)(local_438 + lVar10 * 4);
              lVar10 = lVar10 + 1;
            } while (lVar10 == 1);
            triQuadInterpolate<tcu::Vector<float,3>>
                      ((_anonymous_namespace_ *)local_398,local_258,(float)local_360._0_4_,
                       (float)local_360._4_4_);
            tcu::ConstPixelBufferAccess::getPixelT<float>
                      ((ConstPixelBufferAccess *)local_338,(int)local_3a0,CVar19,CVar20);
            tcu::TextureCubeView::gather
                      ((TextureCubeView *)local_3c8,local_340,(float)local_398._0_4_,
                       (float)local_398._4_4_,local_390._0_4_,(int)&local_208);
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_2a8,(Vec4 *)local_3c8,CVar19,CVar20,0);
            local_438._0_4_ = R;
            local_438._4_4_ = SNORM_INT8;
            TStack_430.order = R;
            TStack_430.type = SNORM_INT8;
            lVar10 = 0;
            do {
              fVar3 = *(float *)(local_338 + lVar10 * 4);
              fVar4 = *(float *)(local_3c8 + lVar10 * 4);
              *(uint *)(local_438 + lVar10 * 4) =
                   ~-(uint)(fVar4 < fVar3) & (uint)(fVar4 - fVar3) |
                   (uint)(fVar3 - fVar4) & -(uint)(fVar4 < fVar3);
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            local_3f8._M_dataplus._M_p = (pointer)local_220;
            local_3f8._M_string_length._0_4_ = TStack_218.order;
            local_3f8._M_string_length._4_4_ = TStack_218.type;
            local_3fc[0] = 0;
            local_3fc[1] = 0;
            local_3fc[2] = 0;
            local_3fc[3] = 0;
            lVar10 = 0;
            do {
              pfVar2 = (float *)((long)&local_3f8._M_dataplus._M_p + lVar10 * 4);
              local_3fc[lVar10] =
                   *pfVar2 <= *(float *)(local_438 + lVar10 * 4) &&
                   *(float *)(local_438 + lVar10 * 4) != *pfVar2;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            local_40c[0] = 0;
            local_40c[1] = 0;
            local_40c[2] = 0;
            local_40c[3] = 0;
            lVar10 = 0;
            do {
              local_40c[lVar10] = local_3fc[lVar10] & local_210.m_data[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            if (local_40c[0] == 0) {
              uVar11 = 0xffffffffffffffff;
              do {
                if (uVar11 == 2) {
                  uVar12 = 3;
                  break;
                }
                uVar12 = uVar11 + 1;
                lVar10 = uVar11 + 2;
                uVar11 = uVar12;
              } while (local_40c[lVar10] != 1);
              if (uVar12 < 3) goto LAB_00608c94;
            }
            else {
LAB_00608c94:
              bVar8 = tcu::isGatherResultValid
                                ((TextureCubeView *)local_340,&local_208,
                                 (LookupPrecision *)local_238,(Vec3 *)local_398,componentNdx,
                                 (Vec4 *)local_338);
              if (!bVar8) {
                *(undefined4 *)
                 ((long)local_378.m_pixels.m_ptr +
                 (long)(int)(local_378.m_width * CVar20 + CVar19) * 4) = 0xff0000ff;
                local_410 = 0;
              }
            }
            CVar19 = CVar19 + A;
          } while (CVar19 != CVar5);
          CVar20 = CVar20 + A;
          TVar21 = local_408;
          uVar18 = local_410;
        } while (CVar20 != CVar5);
      }
      bVar9 = (byte)uVar18;
      local_3b8._M_allocated_capacity._0_4_ = 0x69726556;
      local_3b8._M_allocated_capacity._4_4_ = 0x65527966;
      local_3b8._8_4_ = 0x746c7573;
      local_3c0.order = sR;
      local_3c0.type = SNORM_INT8;
      local_3b8._M_local_buf[0xc] = '\0';
      local_438 = (undefined1  [8])&local_428;
      local_1c8._0_4_ = S;
      local_1c8._4_4_ = SNORM_INT8;
      local_3c8 = (undefined1  [8])&local_3b8;
      local_438 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_438,(ulong)local_1c8);
      local_428._M_allocated_capacity = (size_type)local_1c8;
      *(undefined8 *)local_438 = 0x6163696669726556;
      builtin_strncpy((char *)((long)local_438 + 8),"tion res",8);
      builtin_strncpy((char *)((long)local_438 + 0xf),"sult",4);
      TStack_430.order = local_1c8._0_4_;
      TStack_430.type = local_1c8._4_4_;
      *(char *)((long)local_438 + (long)local_1c8) = '\0';
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)local_338,(string *)local_3c8,(string *)local_438);
      tcu::TestLog::startImageSet
                ((TestLog *)TVar21,(char *)local_338._0_8_,(char *)local_338._32_8_);
      paVar1 = &local_3f8.field_2;
      local_3f8.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_3f8.field_2._M_allocated_capacity._6_2_ = 0x6465;
      local_3f8._M_string_length._0_4_ = RGBA;
      local_3f8._M_string_length._4_4_ = SNORM_INT8;
      local_3f8.field_2._M_local_buf[8] = '\0';
      local_388._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_388._M_allocated_capacity._6_2_ = 0x6465;
      local_388._8_2_ = 0x6920;
      local_388._10_4_ = 0x6567616d;
      local_390 = (void *)0xe;
      local_388._M_local_buf[0xe] = '\0';
      pCVar13 = local_3a0;
      local_3f8._M_dataplus._M_p = (pointer)paVar1;
      local_398 = (undefined1  [8])&local_388;
      tcu::LogImage::LogImage
                ((LogImage *)local_1c8,&local_3f8,(string *)local_398,local_3a0,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_1c8,TVar21.order,__buf_02,(size_t)pCVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity != local_198) {
        operator_delete((void *)local_1a8._M_allocated_capacity,
                        (ulong)(local_198[0]._M_allocated_capacity + 1));
      }
      if (local_1c8 != (undefined1  [8])&local_1b8) {
        operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
      }
      if (local_398 != (undefined1  [8])&local_388) {
        operator_delete((void *)local_398,
                        CONCAT26(local_388._M_allocated_capacity._6_2_,
                                 local_388._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_3f8._M_dataplus._M_p,
                        CONCAT26(local_3f8.field_2._M_allocated_capacity._6_2_,
                                 local_3f8.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if ((ConstPixelBufferAccess *)local_338._32_8_ != (ConstPixelBufferAccess *)(local_338 + 0x30)
         ) {
        operator_delete((void *)local_338._32_8_,(ulong)(local_338._48_8_ + 1));
      }
      if (local_338._0_8_ != (long)local_338 + 0x10) {
        operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
      }
      if (local_438 != (undefined1  [8])&local_428) {
        operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
      }
      if (local_3c8 != (undefined1  [8])&local_3b8) {
        operator_delete((void *)local_3c8,(ulong)(local_3b8._M_allocated_capacity + 1));
      }
      if ((uVar18 & 1) == 0) {
        local_438 = (undefined1  [8])&local_428;
        local_428._M_allocated_capacity = 0x636e657265666552;
        local_428._8_2_ = 0x65;
        TStack_430.order = ARGB;
        TStack_430.type = SNORM_INT8;
        local_338._0_4_ = CHANNELORDER_LAST;
        local_338._4_4_ = SNORM_INT8;
        local_3f8._M_dataplus._M_p = (pointer)paVar1;
        local_3f8._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_3f8,(ulong)local_338);
        local_3f8.field_2._M_allocated_capacity._0_6_ = (undefined6)local_338._0_8_;
        local_3f8.field_2._M_allocated_capacity._6_2_ = SUB82(local_338._0_8_,6);
        *(undefined8 *)local_3f8._M_dataplus._M_p = 0x6572206c61656449;
        builtin_strncpy((char *)((long)local_3f8._M_dataplus._M_p + 8),"ference ",8);
        builtin_strncpy((char *)((long)local_3f8._M_dataplus._M_p + 0xd),"ce image",8);
        local_3f8._M_string_length = local_338._0_8_;
        *(char *)((long)local_3f8._M_dataplus._M_p + local_338._0_8_) = '\0';
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_3c8,&local_280);
        pCVar13 = (ConstPixelBufferAccess *)local_3c8;
        tcu::LogImage::LogImage
                  ((LogImage *)local_1c8,(string *)local_438,&local_3f8,pCVar13,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_1c8,local_408.order,__buf_03,(size_t)pCVar13);
        local_388._M_allocated_capacity._0_6_ = 0x4d726f727245;
        local_388._M_allocated_capacity._6_2_ = 0x7361;
        local_388._8_2_ = 0x6b;
        local_390 = (void *)0x9;
        local_350._M_allocated_capacity = 0x616d20726f727245;
        local_350._8_2_ = 0x6b73;
        local_358 = (void *)0xa;
        local_350._M_local_buf[10] = '\0';
        pSVar14 = &local_378;
        local_398 = (undefined1  [8])&local_388;
        local_360 = (undefined1  [8])&local_350;
        tcu::LogImage::LogImage
                  ((LogImage *)local_338,(string *)local_398,(string *)local_360,pSVar14,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_338,local_408.order,__buf_04,(size_t)pSVar14);
        if ((ConstPixelBufferAccess *)local_338._32_8_ !=
            (ConstPixelBufferAccess *)(local_338 + 0x30)) {
          operator_delete((void *)local_338._32_8_,(ulong)(local_338._48_8_ + 1));
        }
        if (local_338._0_8_ != (long)local_338 + 0x10) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        if (local_360 != (undefined1  [8])&local_350) {
          operator_delete((void *)local_360,local_350._M_allocated_capacity + 1);
        }
        if (local_398 != (undefined1  [8])&local_388) {
          operator_delete((void *)local_398,
                          CONCAT26(local_388._M_allocated_capacity._6_2_,
                                   local_388._M_allocated_capacity._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_allocated_capacity != local_198) {
          operator_delete((void *)local_1a8._M_allocated_capacity,
                          (ulong)(local_198[0]._M_allocated_capacity + 1));
        }
        if (local_1c8 != (undefined1  [8])&local_1b8) {
          operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar1) {
          operator_delete(local_3f8._M_dataplus._M_p,
                          CONCAT26(local_3f8.field_2._M_allocated_capacity._6_2_,
                                   local_3f8.field_2._M_allocated_capacity._0_6_) + 1);
        }
        if (local_438 != (undefined1  [8])&local_428) {
          operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
        }
      }
      tcu::TestLog::endImageSet((TestLog *)local_408);
    }
    else {
LAB_00609185:
      if (2 < uVar18 - 0x1b) {
LAB_00609a17:
        bVar9 = 0;
        goto LAB_00609623;
      }
LAB_00608039:
      lVar10 = 0;
      do {
        *(undefined4 *)(local_238 + lVar10 * 4) = 0x16;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      lVar10 = 3;
      do {
        *(undefined4 *)(local_238 + lVar10 * 4) = 0x10;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 6);
      local_220.order = R;
      local_220.type = SNORM_INT8;
      TStack_218.order = R;
      TStack_218.type = SNORM_INT8;
      local_210.m_data[0] = true;
      local_210.m_data[1] = true;
      local_210.m_data[2] = true;
      local_210.m_data[3] = true;
      if ((uVar18 < 0x22) && ((0x2c0000000U >> ((ulong)uVar18 & 0x3f) & 1) != 0)) {
        CVar5 = (local_3a0->m_size).m_data[0];
        local_238._0_4_ = CVar20;
        local_238._4_4_ = CVar20;
        local_238._8_4_ = iVar22;
        local_238._12_4_ = iVar17;
        local_238._16_4_ = iVar17;
        local_238._20_4_ = iVar16;
        tcu::TextureLevel::TextureLevel(&local_280,&local_3a0->m_format,CVar5,CVar5,1);
        TVar21 = local_408;
        tcu::TextureLevel::getAccess((PixelBufferAccess *)local_2a8,&local_280);
        tcu::Surface::Surface(&local_378,CVar5,CVar5);
        local_338._0_4_ = RGBA;
        local_338._4_4_ = UNORM_INT8;
        if ((void *)local_378.m_pixels.m_cap != (void *)0x0) {
          local_378.m_pixels.m_cap = (size_t)local_378.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_1c8,(TextureFormat *)local_338,local_378.m_width,
                   local_378.m_height,1,(void *)local_378.m_pixels.m_cap);
        local_3c8._0_4_ = -1.7146522e+38;
        tcu::RGBA::toVec((RGBA *)local_338);
        tcu::clear((PixelBufferAccess *)local_1c8,(Vec4 *)local_338);
        if ((int)CVar5 < 1) {
          uVar18 = 1;
        }
        else {
          local_3cc = (float)(int)CVar5;
          local_410 = (uint)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
          CVar20 = R;
          do {
            local_400 = (float)(int)CVar20;
            CVar19 = R;
            do {
              local_1b8._M_allocated_capacity = 0;
              local_1b8._8_8_ = 0;
              local_1c8._0_4_ = R;
              local_1c8._4_4_ = SNORM_INT8;
              TStack_1c0.order = R;
              TStack_1c0.type = SNORM_INT8;
              local_338._4_4_ = CVar20;
              local_338._0_4_ = CVar19;
              (**pPVar7->_vptr_PixelOffsets)(pPVar7,(TextureCubeView *)local_338,local_1c8);
              local_3c8._4_4_ = local_400;
              local_3c8._0_4_ = (float)(int)CVar19;
              local_338._0_4_ = R;
              local_338._4_4_ = SNORM_INT8;
              lVar10 = 0;
              do {
                *(float *)(local_338 + lVar10 * 4) = *(float *)(local_3c8 + lVar10 * 4) + 0.5;
                lVar10 = lVar10 + 1;
              } while (lVar10 == 1);
              local_438._4_4_ = local_3cc;
              local_438._0_4_ = local_3cc;
              local_360 = (undefined1  [8])0x0;
              lVar10 = 0;
              do {
                *(float *)(local_360 + lVar10 * 4) =
                     *(float *)(local_338 + lVar10 * 4) / *(float *)(local_438 + lVar10 * 4);
                lVar10 = lVar10 + 1;
              } while (lVar10 == 1);
              triQuadInterpolate<tcu::Vector<float,3>>
                        ((_anonymous_namespace_ *)local_398,local_258,(float)local_360._0_4_,
                         (float)local_360._4_4_);
              tcu::ConstPixelBufferAccess::getPixelT<unsigned_int>
                        ((ConstPixelBufferAccess *)local_3c8,(int)local_3a0,CVar19,CVar20);
              tcu::TextureCubeView::gather
                        ((TextureCubeView *)local_338,local_340,(float)local_398._0_4_,
                         (float)local_398._4_4_,local_390._0_4_,(int)&local_208);
              local_438._0_4_ = R;
              local_438._4_4_ = SNORM_INT8;
              TStack_430.order = R;
              TStack_430.type = SNORM_INT8;
              lVar10 = 0;
              do {
                *(int *)(local_438 + lVar10 * 4) = (int)(long)*(float *)(local_338 + lVar10 * 4);
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              local_338._0_8_ = local_438;
              local_338._8_4_ = TStack_430.order;
              local_338._12_4_ = TStack_430.type;
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)local_2a8,(IVec4 *)local_338,CVar19,CVar20,0);
              local_338._0_4_ = R;
              local_338._4_4_ = SNORM_INT8;
              local_338._8_8_ = (ConstPixelBufferAccess *)0x0;
              lVar10 = 0;
              do {
                uVar18 = *(uint *)(local_438 + lVar10 * 4);
                uVar6 = *(uint *)(local_3c8 + lVar10 * 4);
                iVar17 = uVar18 - uVar6;
                if (uVar18 < uVar6) {
                  iVar17 = -(uVar18 - uVar6);
                }
                *(int *)(local_338 + lVar10 * 4) = iVar17;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              local_3f8._M_dataplus._M_p = (pointer)local_220;
              local_3f8._M_string_length._0_4_ = TStack_218.order;
              local_3f8._M_string_length._4_4_ = TStack_218.type;
              local_3fc[0] = 0;
              local_3fc[1] = 0;
              local_3fc[2] = 0;
              local_3fc[3] = 0;
              lVar10 = 0;
              do {
                local_3fc[lVar10] =
                     *(uint *)((long)&local_3f8._M_dataplus._M_p + lVar10 * 4) <
                     *(uint *)(local_338 + lVar10 * 4);
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              local_40c[0] = 0;
              local_40c[1] = 0;
              local_40c[2] = 0;
              local_40c[3] = 0;
              lVar10 = 0;
              do {
                local_40c[lVar10] = local_3fc[lVar10] & local_210.m_data[lVar10];
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              if (local_40c[0] == 0) {
                uVar11 = 0xffffffffffffffff;
                do {
                  if (uVar11 == 2) {
                    uVar12 = 3;
                    break;
                  }
                  uVar12 = uVar11 + 1;
                  lVar10 = uVar11 + 2;
                  uVar11 = uVar12;
                } while (local_40c[lVar10] != 1);
                if (uVar12 < 3) goto LAB_006083e5;
              }
              else {
LAB_006083e5:
                bVar8 = tcu::isGatherResultValid
                                  ((TextureCubeView *)local_340,&local_208,
                                   (IntLookupPrecision *)local_238,(Vec3 *)local_398,componentNdx,
                                   (UVec4 *)local_3c8);
                if (!bVar8) {
                  *(undefined4 *)
                   ((long)local_378.m_pixels.m_ptr +
                   (long)(int)(local_378.m_width * CVar20 + CVar19) * 4) = 0xff0000ff;
                  local_410 = 0;
                }
              }
              CVar19 = CVar19 + A;
            } while (CVar19 != CVar5);
            CVar20 = CVar20 + A;
            TVar21 = local_408;
            uVar18 = local_410;
          } while (CVar20 != CVar5);
        }
        bVar9 = (byte)uVar18;
        local_3b8._M_allocated_capacity._0_4_ = 0x69726556;
        local_3b8._M_allocated_capacity._4_4_ = 0x65527966;
        local_3b8._8_4_ = 0x746c7573;
        local_3c0.order = sR;
        local_3c0.type = SNORM_INT8;
        local_3b8._M_local_buf[0xc] = '\0';
        local_438 = (undefined1  [8])&local_428;
        local_1c8._0_4_ = S;
        local_1c8._4_4_ = SNORM_INT8;
        local_3c8 = (undefined1  [8])&local_3b8;
        local_438 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_438,(ulong)local_1c8);
        local_428._M_allocated_capacity = (size_type)local_1c8;
        *(undefined8 *)local_438 = 0x6163696669726556;
        builtin_strncpy((char *)((long)local_438 + 8),"tion res",8);
        builtin_strncpy((char *)((long)local_438 + 0xf),"sult",4);
        TStack_430.order = local_1c8._0_4_;
        TStack_430.type = local_1c8._4_4_;
        *(char *)((long)local_438 + (long)local_1c8) = '\0';
        tcu::LogImageSet::LogImageSet
                  ((LogImageSet *)local_338,(string *)local_3c8,(string *)local_438);
        tcu::TestLog::startImageSet
                  ((TestLog *)TVar21,(char *)local_338._0_8_,(char *)local_338._32_8_);
        paVar1 = &local_3f8.field_2;
        local_3f8.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
        local_3f8.field_2._M_allocated_capacity._6_2_ = 0x6465;
        local_3f8._M_string_length._0_4_ = RGBA;
        local_3f8._M_string_length._4_4_ = SNORM_INT8;
        local_3f8.field_2._M_local_buf[8] = '\0';
        local_388._M_allocated_capacity._0_6_ = 0x7265646e6552;
        local_388._M_allocated_capacity._6_2_ = 0x6465;
        local_388._8_2_ = 0x6920;
        local_388._10_4_ = 0x6567616d;
        local_390 = (void *)0xe;
        local_388._M_local_buf[0xe] = '\0';
        pCVar13 = local_3a0;
        local_3f8._M_dataplus._M_p = (pointer)paVar1;
        local_398 = (undefined1  [8])&local_388;
        tcu::LogImage::LogImage
                  ((LogImage *)local_1c8,&local_3f8,(string *)local_398,local_3a0,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_1c8,TVar21.order,__buf_05,(size_t)pCVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_allocated_capacity != local_198) {
          operator_delete((void *)local_1a8._M_allocated_capacity,
                          (ulong)(local_198[0]._M_allocated_capacity + 1));
        }
        if (local_1c8 != (undefined1  [8])&local_1b8) {
          operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
        }
        if (local_398 != (undefined1  [8])&local_388) {
          operator_delete((void *)local_398,
                          CONCAT26(local_388._M_allocated_capacity._6_2_,
                                   local_388._M_allocated_capacity._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar1) {
          operator_delete(local_3f8._M_dataplus._M_p,
                          CONCAT26(local_3f8.field_2._M_allocated_capacity._6_2_,
                                   local_3f8.field_2._M_allocated_capacity._0_6_) + 1);
        }
        if ((ConstPixelBufferAccess *)local_338._32_8_ !=
            (ConstPixelBufferAccess *)(local_338 + 0x30)) {
          operator_delete((void *)local_338._32_8_,(ulong)(local_338._48_8_ + 1));
        }
        if (local_338._0_8_ != (long)local_338 + 0x10) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        if (local_438 != (undefined1  [8])&local_428) {
          operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
        }
        if (local_3c8 != (undefined1  [8])&local_3b8) {
          operator_delete((void *)local_3c8,(ulong)(local_3b8._M_allocated_capacity + 1));
        }
        if ((uVar18 & 1) == 0) {
          local_438 = (undefined1  [8])&local_428;
          local_428._M_allocated_capacity = 0x636e657265666552;
          local_428._8_2_ = 0x65;
          TStack_430.order = ARGB;
          TStack_430.type = SNORM_INT8;
          local_338._0_4_ = CHANNELORDER_LAST;
          local_338._4_4_ = SNORM_INT8;
          local_3f8._M_dataplus._M_p = (pointer)paVar1;
          local_3f8._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_3f8,(ulong)local_338);
          local_3f8.field_2._M_allocated_capacity._0_6_ = (undefined6)local_338._0_8_;
          local_3f8.field_2._M_allocated_capacity._6_2_ = SUB82(local_338._0_8_,6);
          *(undefined8 *)local_3f8._M_dataplus._M_p = 0x6572206c61656449;
          builtin_strncpy((char *)((long)local_3f8._M_dataplus._M_p + 8),"ference ",8);
          builtin_strncpy((char *)((long)local_3f8._M_dataplus._M_p + 0xd),"ce image",8);
          local_3f8._M_string_length = local_338._0_8_;
          *(char *)((long)local_3f8._M_dataplus._M_p + local_338._0_8_) = '\0';
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)local_3c8,&local_280);
          pCVar13 = (ConstPixelBufferAccess *)local_3c8;
          tcu::LogImage::LogImage
                    ((LogImage *)local_1c8,(string *)local_438,&local_3f8,pCVar13,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_1c8,local_408.order,__buf_06,(size_t)pCVar13);
          local_388._M_allocated_capacity._0_6_ = 0x4d726f727245;
          local_388._M_allocated_capacity._6_2_ = 0x7361;
          local_388._8_2_ = 0x6b;
          local_390 = (void *)0x9;
          local_350._M_allocated_capacity = 0x616d20726f727245;
          local_350._8_2_ = 0x6b73;
          local_358 = (void *)0xa;
          local_350._M_local_buf[10] = '\0';
          pSVar14 = &local_378;
          local_398 = (undefined1  [8])&local_388;
          local_360 = (undefined1  [8])&local_350;
          tcu::LogImage::LogImage
                    ((LogImage *)local_338,(string *)local_398,(string *)local_360,pSVar14,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_338,local_408.order,__buf_07,(size_t)pSVar14);
          if ((ConstPixelBufferAccess *)local_338._32_8_ !=
              (ConstPixelBufferAccess *)(local_338 + 0x30)) {
            operator_delete((void *)local_338._32_8_,(ulong)(local_338._48_8_ + 1));
          }
          if (local_338._0_8_ != (long)local_338 + 0x10) {
            operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
          }
          if (local_360 != (undefined1  [8])&local_350) {
            operator_delete((void *)local_360,local_350._M_allocated_capacity + 1);
          }
          if (local_398 != (undefined1  [8])&local_388) {
            operator_delete((void *)local_398,
                            CONCAT26(local_388._M_allocated_capacity._6_2_,
                                     local_388._M_allocated_capacity._0_6_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_allocated_capacity != local_198) {
            operator_delete((void *)local_1a8._M_allocated_capacity,
                            (ulong)(local_198[0]._M_allocated_capacity + 1));
          }
          if (local_1c8 != (undefined1  [8])&local_1b8) {
            operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != paVar1) {
            operator_delete(local_3f8._M_dataplus._M_p,
                            CONCAT26(local_3f8.field_2._M_allocated_capacity._6_2_,
                                     local_3f8.field_2._M_allocated_capacity._0_6_) + 1);
          }
          if (local_438 != (undefined1  [8])&local_428) {
            operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
          }
        }
        tcu::TestLog::endImageSet((TestLog *)local_408);
      }
      else {
        local_238._0_4_ = CVar20;
        local_238._4_4_ = CVar20;
        local_238._8_4_ = iVar22;
        local_238._12_4_ = iVar17;
        local_238._16_4_ = iVar17;
        local_238._20_4_ = iVar16;
        if (2 < uVar18 - 0x1b) goto LAB_00609a17;
        CVar5 = (local_3a0->m_size).m_data[0];
        tcu::TextureLevel::TextureLevel(&local_280,&local_3a0->m_format,CVar5,CVar5,1);
        tcu::TextureLevel::getAccess((PixelBufferAccess *)local_2a8,&local_280);
        tcu::Surface::Surface(&local_378,CVar5,CVar5);
        local_338._0_4_ = RGBA;
        local_338._4_4_ = UNORM_INT8;
        if ((void *)local_378.m_pixels.m_cap != (void *)0x0) {
          local_378.m_pixels.m_cap = (size_t)local_378.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_1c8,(TextureFormat *)local_338,local_378.m_width,
                   local_378.m_height,1,(void *)local_378.m_pixels.m_cap);
        local_3c8._0_4_ = -1.7146522e+38;
        tcu::RGBA::toVec((RGBA *)local_338);
        tcu::clear((PixelBufferAccess *)local_1c8,(Vec4 *)local_338);
        if ((int)CVar5 < 1) {
          uVar18 = 1;
        }
        else {
          local_3cc = (float)(int)CVar5;
          local_410 = (uint)CONCAT71((int7)((ulong)extraout_RAX_02 >> 8),1);
          CVar20 = R;
          do {
            local_400 = (float)(int)CVar20;
            CVar19 = R;
            do {
              local_1b8._M_allocated_capacity = 0;
              local_1b8._8_8_ = 0;
              local_1c8._0_4_ = R;
              local_1c8._4_4_ = SNORM_INT8;
              TStack_1c0.order = R;
              TStack_1c0.type = SNORM_INT8;
              local_338._4_4_ = CVar20;
              local_338._0_4_ = CVar19;
              (**pPVar7->_vptr_PixelOffsets)(pPVar7,(TextureCubeView *)local_338,local_1c8);
              local_3c8._4_4_ = local_400;
              local_3c8._0_4_ = (float)(int)CVar19;
              local_338._0_4_ = R;
              local_338._4_4_ = SNORM_INT8;
              lVar10 = 0;
              do {
                *(float *)(local_338 + lVar10 * 4) = *(float *)(local_3c8 + lVar10 * 4) + 0.5;
                lVar10 = lVar10 + 1;
              } while (lVar10 == 1);
              local_438._4_4_ = local_3cc;
              local_438._0_4_ = local_3cc;
              local_360 = (undefined1  [8])0x0;
              lVar10 = 0;
              do {
                *(float *)(local_360 + lVar10 * 4) =
                     *(float *)(local_338 + lVar10 * 4) / *(float *)(local_438 + lVar10 * 4);
                lVar10 = lVar10 + 1;
              } while (lVar10 == 1);
              triQuadInterpolate<tcu::Vector<float,3>>
                        ((_anonymous_namespace_ *)local_398,local_258,(float)local_360._0_4_,
                         (float)local_360._4_4_);
              tcu::ConstPixelBufferAccess::getPixelT<int>
                        ((ConstPixelBufferAccess *)local_3c8,(int)local_3a0,CVar19,CVar20);
              tcu::TextureCubeView::gather
                        ((TextureCubeView *)local_338,local_340,(float)local_398._0_4_,
                         (float)local_398._4_4_,local_390._0_4_,(int)&local_208);
              local_438._0_4_ = R;
              local_438._4_4_ = SNORM_INT8;
              TStack_430.order = R;
              TStack_430.type = SNORM_INT8;
              lVar10 = 0;
              do {
                *(int *)(local_438 + lVar10 * 4) = (int)*(float *)(local_338 + lVar10 * 4);
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)local_2a8,(IVec4 *)local_438,CVar19,CVar20,0);
              local_338._0_4_ = R;
              local_338._4_4_ = SNORM_INT8;
              local_338._8_8_ = (ConstPixelBufferAccess *)0x0;
              lVar10 = 0;
              do {
                iVar17 = *(int *)(local_3c8 + lVar10 * 4);
                iVar22 = *(int *)(local_438 + lVar10 * 4);
                iVar16 = iVar17 - iVar22;
                if (iVar17 - iVar22 == 0 || iVar17 < iVar22) {
                  iVar16 = -(iVar17 - iVar22);
                }
                *(int *)(local_338 + lVar10 * 4) = iVar16;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              local_3f8._M_dataplus._M_p = (pointer)local_220;
              local_3f8._M_string_length._0_4_ = TStack_218.order;
              local_3f8._M_string_length._4_4_ = TStack_218.type;
              local_3fc[0] = 0;
              local_3fc[1] = 0;
              local_3fc[2] = 0;
              local_3fc[3] = 0;
              lVar10 = 0;
              do {
                local_3fc[lVar10] =
                     *(int *)((long)&local_3f8._M_dataplus._M_p + lVar10 * 4) <
                     *(int *)(local_338 + lVar10 * 4);
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              local_40c[0] = 0;
              local_40c[1] = 0;
              local_40c[2] = 0;
              local_40c[3] = 0;
              lVar10 = 0;
              do {
                local_40c[lVar10] = local_3fc[lVar10] & local_210.m_data[lVar10];
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              if (local_40c[0] == 0) {
                uVar11 = 0xffffffffffffffff;
                do {
                  if (uVar11 == 2) {
                    uVar12 = 3;
                    break;
                  }
                  uVar12 = uVar11 + 1;
                  lVar10 = uVar11 + 2;
                  uVar11 = uVar12;
                } while (local_40c[lVar10] != 1);
                if (uVar12 < 3) goto LAB_0060999c;
              }
              else {
LAB_0060999c:
                bVar8 = tcu::isGatherResultValid
                                  ((TextureCubeView *)local_340,&local_208,
                                   (IntLookupPrecision *)local_238,(Vec3 *)local_398,componentNdx,
                                   (IVec4 *)local_3c8);
                if (!bVar8) {
                  *(undefined4 *)
                   ((long)local_378.m_pixels.m_ptr +
                   (long)(int)(local_378.m_width * CVar20 + CVar19) * 4) = 0xff0000ff;
                  local_410 = 0;
                }
              }
              CVar19 = CVar19 + A;
            } while (CVar19 != CVar5);
            CVar20 = CVar20 + A;
            TVar21 = local_408;
            uVar18 = local_410;
          } while (CVar20 != CVar5);
        }
        bVar9 = (byte)uVar18;
        local_3b8._M_allocated_capacity._0_4_ = 0x69726556;
        local_3b8._M_allocated_capacity._4_4_ = 0x65527966;
        local_3b8._8_4_ = 0x746c7573;
        local_3c0.order = sR;
        local_3c0.type = SNORM_INT8;
        local_3b8._M_local_buf[0xc] = '\0';
        local_438 = (undefined1  [8])&local_428;
        local_1c8._0_4_ = S;
        local_1c8._4_4_ = SNORM_INT8;
        local_3c8 = (undefined1  [8])&local_3b8;
        local_438 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_438,(ulong)local_1c8);
        local_428._M_allocated_capacity = (size_type)local_1c8;
        *(undefined8 *)local_438 = 0x6163696669726556;
        builtin_strncpy((char *)((long)local_438 + 8),"tion res",8);
        builtin_strncpy((char *)((long)local_438 + 0xf),"sult",4);
        TStack_430.order = local_1c8._0_4_;
        TStack_430.type = local_1c8._4_4_;
        *(char *)((long)local_438 + (long)local_1c8) = '\0';
        tcu::LogImageSet::LogImageSet
                  ((LogImageSet *)local_338,(string *)local_3c8,(string *)local_438);
        tcu::TestLog::startImageSet
                  ((TestLog *)TVar21,(char *)local_338._0_8_,(char *)local_338._32_8_);
        paVar1 = &local_3f8.field_2;
        local_3f8.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
        local_3f8.field_2._M_allocated_capacity._6_2_ = 0x6465;
        local_3f8._M_string_length._0_4_ = RGBA;
        local_3f8._M_string_length._4_4_ = SNORM_INT8;
        local_3f8.field_2._M_local_buf[8] = '\0';
        local_388._M_allocated_capacity._0_6_ = 0x7265646e6552;
        local_388._M_allocated_capacity._6_2_ = 0x6465;
        local_388._8_2_ = 0x6920;
        local_388._10_4_ = 0x6567616d;
        local_390 = (void *)0xe;
        local_388._M_local_buf[0xe] = '\0';
        pCVar13 = local_3a0;
        local_3f8._M_dataplus._M_p = (pointer)paVar1;
        local_398 = (undefined1  [8])&local_388;
        tcu::LogImage::LogImage
                  ((LogImage *)local_1c8,&local_3f8,(string *)local_398,local_3a0,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_1c8,TVar21.order,__buf_08,(size_t)pCVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_allocated_capacity != local_198) {
          operator_delete((void *)local_1a8._M_allocated_capacity,
                          (ulong)(local_198[0]._M_allocated_capacity + 1));
        }
        if (local_1c8 != (undefined1  [8])&local_1b8) {
          operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
        }
        if (local_398 != (undefined1  [8])&local_388) {
          operator_delete((void *)local_398,
                          CONCAT26(local_388._M_allocated_capacity._6_2_,
                                   local_388._M_allocated_capacity._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar1) {
          operator_delete(local_3f8._M_dataplus._M_p,
                          CONCAT26(local_3f8.field_2._M_allocated_capacity._6_2_,
                                   local_3f8.field_2._M_allocated_capacity._0_6_) + 1);
        }
        if ((ConstPixelBufferAccess *)local_338._32_8_ !=
            (ConstPixelBufferAccess *)(local_338 + 0x30)) {
          operator_delete((void *)local_338._32_8_,(ulong)(local_338._48_8_ + 1));
        }
        if (local_338._0_8_ != (long)local_338 + 0x10) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        if (local_438 != (undefined1  [8])&local_428) {
          operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
        }
        if (local_3c8 != (undefined1  [8])&local_3b8) {
          operator_delete((void *)local_3c8,(ulong)(local_3b8._M_allocated_capacity + 1));
        }
        if ((uVar18 & 1) == 0) {
          local_438 = (undefined1  [8])&local_428;
          local_428._M_allocated_capacity = 0x636e657265666552;
          local_428._8_2_ = 0x65;
          TStack_430.order = ARGB;
          TStack_430.type = SNORM_INT8;
          local_3f8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3f8,"Ideal reference image","");
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)local_3c8,&local_280);
          pCVar13 = (ConstPixelBufferAccess *)local_3c8;
          tcu::LogImage::LogImage
                    ((LogImage *)local_1c8,(string *)local_438,&local_3f8,pCVar13,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_1c8,local_408.order,__buf_09,(size_t)pCVar13);
          local_388._M_allocated_capacity._0_6_ = 0x4d726f727245;
          local_388._M_allocated_capacity._6_2_ = 0x7361;
          local_388._8_2_ = 0x6b;
          local_390 = (void *)0x9;
          local_350._M_allocated_capacity = 0x616d20726f727245;
          local_350._8_2_ = 0x6b73;
          local_358 = (void *)0xa;
          local_350._M_local_buf[10] = '\0';
          pSVar14 = &local_378;
          local_398 = (undefined1  [8])&local_388;
          local_360 = (undefined1  [8])&local_350;
          tcu::LogImage::LogImage
                    ((LogImage *)local_338,(string *)local_398,(string *)local_360,pSVar14,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_338,local_408.order,__buf_10,(size_t)pSVar14);
          if ((ConstPixelBufferAccess *)local_338._32_8_ !=
              (ConstPixelBufferAccess *)(local_338 + 0x30)) {
            operator_delete((void *)local_338._32_8_,(ulong)(local_338._48_8_ + 1));
          }
          if (local_338._0_8_ != (long)local_338 + 0x10) {
            operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
          }
          if (local_360 != (undefined1  [8])&local_350) {
            operator_delete((void *)local_360,local_350._M_allocated_capacity + 1);
          }
          if (local_398 != (undefined1  [8])&local_388) {
            operator_delete((void *)local_398,
                            CONCAT26(local_388._M_allocated_capacity._6_2_,
                                     local_388._M_allocated_capacity._0_6_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_allocated_capacity != local_198) {
            operator_delete((void *)local_1a8._M_allocated_capacity,
                            (ulong)(local_198[0]._M_allocated_capacity + 1));
          }
          if (local_1c8 != (undefined1  [8])&local_1b8) {
            operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != paVar1) {
            operator_delete(local_3f8._M_dataplus._M_p,
                            CONCAT26(local_3f8.field_2._M_allocated_capacity._6_2_,
                                     local_3f8.field_2._M_allocated_capacity._0_6_) + 1);
          }
          if (local_438 != (undefined1  [8])&local_428) {
            operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
          }
        }
        tcu::TestLog::endImageSet((TestLog *)local_408);
      }
    }
    tcu::Surface::~Surface(&local_378);
    tcu::TextureLevel::~TextureLevel(&local_280);
  }
LAB_00609623:
  if (local_250.
      super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
      .m_data.ptr != (PixelOffsets *)0x0) {
    (*(local_250.
       super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
       .m_data.ptr)->_vptr_PixelOffsets[2])();
  }
LAB_00609642:
  return (bool)(bVar9 & 1);
}

Assistant:

bool TextureGatherCase::verify (const ConstPixelBufferAccess&	rendered,
								const TexViewT&					texture,
								const TexCoordT					(&texCoords)[4],
								const GatherArgs&				gatherArgs) const
{
	TestLog& log = m_testCtx.getLog();

	if (m_flags & GATHERCASE_MIPMAP_INCOMPLETE)
	{
		const int	componentNdx		= de::max(0, gatherArgs.componentNdx);
		const Vec4	incompleteColor		(0.0f, 0.0f, 0.0f, 1.0f);
		const Vec4	refColor			(incompleteColor[componentNdx]);
		const bool	isOk				= verifySingleColored(log, rendered, refColor);

		if (!isOk)
			log << TestLog::Message << "Note: expected color " << refColor << " for all pixels; "
									<< incompleteColor[componentNdx] << " is component at index " << componentNdx
									<< " in the color " << incompleteColor << ", which is used for incomplete textures" << TestLog::EndMessage;

		return isOk;
	}
	else
	{
		DE_ASSERT(m_colorBufferFormat.order == tcu::TextureFormat::RGBA);
		DE_ASSERT(m_colorBufferFormat.type == tcu::TextureFormat::UNORM_INT8		||
				  m_colorBufferFormat.type == tcu::TextureFormat::UNSIGNED_INT8		||
				  m_colorBufferFormat.type == tcu::TextureFormat::SIGNED_INT8);

		const MovePtr<PixelOffsets>		pixelOffsets	= makePixelOffsetsFunctor(m_gatherType, gatherArgs, getOffsetRange());
		const tcu::PixelFormat			pixelFormat		= tcu::PixelFormat(8,8,8,8);
		const IVec4						colorBits		= tcu::max(glu::TextureTestUtil::getBitsVec(pixelFormat) - 1, tcu::IVec4(0));
		const IVec3						coordBits		= m_textureType == TEXTURETYPE_2D			? IVec3(20,20,0)
														: m_textureType == TEXTURETYPE_CUBE			? IVec3(10,10,10)
														: m_textureType == TEXTURETYPE_2D_ARRAY		? IVec3(20,20,20)
														: IVec3(-1);
		const IVec3						uvwBits			= m_textureType == TEXTURETYPE_2D			? IVec3(7,7,0)
														: m_textureType == TEXTURETYPE_CUBE			? IVec3(6,6,0)
														: m_textureType == TEXTURETYPE_2D_ARRAY		? IVec3(7,7,7)
														: IVec3(-1);
		tcu::Sampler					sampler;
		sampler.wrapS		= m_wrapS;
		sampler.wrapT		= m_wrapT;
		sampler.compare		= m_shadowCompareMode;

		if (isDepthFormat(m_textureFormat))
		{
			tcu::TexComparePrecision comparePrec;
			comparePrec.coordBits		= coordBits;
			comparePrec.uvwBits			= uvwBits;
			comparePrec.referenceBits	= 16;
			comparePrec.resultBits		= pixelFormat.redBits-1;

			return verifyGatherOffsetsCompare(log, rendered, texture, texCoords, sampler, comparePrec, PixelCompareRefZDefault(RENDER_SIZE), *pixelOffsets);
		}
		else
		{
			const int componentNdx = de::max(0, gatherArgs.componentNdx);

			if (isUnormFormatType(m_textureFormat.type))
			{
				tcu::LookupPrecision lookupPrec;
				lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(colorBits);
				lookupPrec.coordBits		= coordBits;
				lookupPrec.uvwBits			= uvwBits;
				lookupPrec.colorMask		= glu::TextureTestUtil::getCompareMask(pixelFormat);
				return verifyGatherOffsets<float>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
			}
			else if (isUIntFormatType(m_textureFormat.type) || isSIntFormatType(m_textureFormat.type))
			{
				tcu::IntLookupPrecision		lookupPrec;
				lookupPrec.colorThreshold	= UVec4(0);
				lookupPrec.coordBits		= coordBits;
				lookupPrec.uvwBits			= uvwBits;
				lookupPrec.colorMask		= glu::TextureTestUtil::getCompareMask(pixelFormat);

				if (isUIntFormatType(m_textureFormat.type))
					return verifyGatherOffsets<deUint32>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
				else if (isSIntFormatType(m_textureFormat.type))
					return verifyGatherOffsets<deInt32>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
				else
				{
					DE_ASSERT(false);
					return false;
				}
			}
			else
			{
				DE_ASSERT(false);
				return false;
			}
		}
	}
}